

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

idx_t __thiscall duckdb::Pipeline::UpdateBatchIndex(Pipeline *this,idx_t old_index,idx_t new_index)

{
  multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  idx_t iVar1;
  iterator __position;
  InternalException *pIVar2;
  allocator local_59;
  idx_t old_index_local;
  idx_t new_index_local;
  string local_48;
  
  old_index_local = old_index;
  new_index_local = new_index;
  ::std::mutex::lock(&this->batch_lock);
  if (new_index <
      *(ulong *)((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1)) {
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,
               "Processing batch index %llu, but previous min batch index was %llu",&local_59);
    InternalException::InternalException<unsigned_long,unsigned_long>
              (pIVar2,&local_48,new_index,
               *(unsigned_long *)
                ((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = &this->batch_indexes;
  __position = ::std::
               _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               ::find(&this_00->_M_t,&old_index_local);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->batch_indexes)._M_t._M_impl.super__Rb_tree_header) {
    ::std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)this_00,(const_iterator)__position._M_node);
    ::std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_equal<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)this_00,&new_index_local);
    iVar1 = *(idx_t *)((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                      1);
    pthread_mutex_unlock((pthread_mutex_t *)&this->batch_lock);
    return iVar1;
  }
  pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Batch index %llu was not found in set of active batch indexes",
             &local_59);
  InternalException::InternalException<unsigned_long>(pIVar2,&local_48,old_index_local);
  __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t Pipeline::UpdateBatchIndex(idx_t old_index, idx_t new_index) {
	lock_guard<mutex> l(batch_lock);
	if (new_index < *batch_indexes.begin()) {
		throw InternalException("Processing batch index %llu, but previous min batch index was %llu", new_index,
		                        *batch_indexes.begin());
	}
	auto entry = batch_indexes.find(old_index);
	if (entry == batch_indexes.end()) {
		throw InternalException("Batch index %llu was not found in set of active batch indexes", old_index);
	}
	batch_indexes.erase(entry);
	batch_indexes.insert(new_index);
	return *batch_indexes.begin();
}